

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void init_rd_sf(RD_CALC_SPEED_FEATURES *rd_sf,AV1EncoderConfig *oxcf)

{
  undefined1 uVar1;
  int iVar2;
  long in_RSI;
  undefined4 *in_RDI;
  int disable_trellis_quant;
  
  iVar2 = *(int *)(in_RSI + 0x34);
  if (iVar2 == 3) {
    iVar2 = is_lossless_requested((RateControlCfg *)(in_RSI + 0x70));
    uVar1 = 0;
    if (iVar2 == 0) {
      uVar1 = 3;
    }
    *(undefined1 *)(in_RDI + 3) = uVar1;
  }
  else if (iVar2 == 2) {
    iVar2 = is_lossless_requested((RateControlCfg *)(in_RSI + 0x70));
    uVar1 = 0;
    if (iVar2 == 0) {
      uVar1 = 2;
    }
    *(undefined1 *)(in_RDI + 3) = uVar1;
  }
  else if (iVar2 == 0) {
    iVar2 = is_lossless_requested((RateControlCfg *)(in_RSI + 0x70));
    if (iVar2 == 0) {
      *(undefined1 *)(in_RDI + 3) = 1;
    }
    else {
      *(undefined1 *)(in_RDI + 3) = 0;
    }
  }
  else if (iVar2 == 1) {
    *(undefined1 *)(in_RDI + 3) = 0;
  }
  in_RDI[4] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[5] = 0;
  return;
}

Assistant:

static inline void init_rd_sf(RD_CALC_SPEED_FEATURES *rd_sf,
                              const AV1EncoderConfig *oxcf) {
  const int disable_trellis_quant = oxcf->algo_cfg.disable_trellis_quant;
  if (disable_trellis_quant == 3) {
    rd_sf->optimize_coefficients = !is_lossless_requested(&oxcf->rc_cfg)
                                       ? NO_ESTIMATE_YRD_TRELLIS_OPT
                                       : NO_TRELLIS_OPT;
  } else if (disable_trellis_quant == 2) {
    rd_sf->optimize_coefficients = !is_lossless_requested(&oxcf->rc_cfg)
                                       ? FINAL_PASS_TRELLIS_OPT
                                       : NO_TRELLIS_OPT;
  } else if (disable_trellis_quant == 0) {
    if (is_lossless_requested(&oxcf->rc_cfg)) {
      rd_sf->optimize_coefficients = NO_TRELLIS_OPT;
    } else {
      rd_sf->optimize_coefficients = FULL_TRELLIS_OPT;
    }
  } else if (disable_trellis_quant == 1) {
    rd_sf->optimize_coefficients = NO_TRELLIS_OPT;
  } else {
    assert(0 && "Invalid disable_trellis_quant value");
  }
  rd_sf->use_mb_rd_hash = 0;
  rd_sf->simple_model_rd_from_var = 0;
  rd_sf->tx_domain_dist_level = 0;
  rd_sf->tx_domain_dist_thres_level = 0;
  rd_sf->perform_coeff_opt = 0;
}